

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * strarray_get(strarray *array,size_t idx)

{
  size_t sVar1;
  bool bVar2;
  char *local_30;
  char *ptr;
  size_t count;
  size_t idx_local;
  strarray *array_local;
  
  ptr = (char *)0x0;
  local_30 = array->value;
  while( true ) {
    bVar2 = false;
    if (local_30 != (char *)0x0) {
      bVar2 = local_30 < array->value + array->length;
    }
    if (!bVar2) break;
    if (ptr == (char *)idx) {
      return local_30;
    }
    ptr = ptr + 1;
    sVar1 = strlen(local_30);
    local_30 = local_30 + sVar1 + 1;
  }
  return (char *)0x0;
}

Assistant:

char *
strarray_get(const struct strarray *array, size_t idx) {
  size_t count = 0;
  char *ptr;

  strarray_for_each_element(array, ptr) {
    if (count == idx) {
      return ptr;
    }
    count++;
  }
  return NULL;
}